

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

SynFunctionDefinition *
GetGenericFunctionDefinition(ExpressionContext *ctx,SynBase *source,FunctionData *function)

{
  Lexeme *pos;
  int iVar1;
  undefined4 extraout_var;
  SynFunctionDefinition *pSVar2;
  ParseContext *this;
  
  pSVar2 = function->definition;
  if (pSVar2 == (SynFunctionDefinition *)0x0) {
    if (function->delayedDefinition == (Lexeme *)0x0) {
      pSVar2 = (SynFunctionDefinition *)0x0;
    }
    else {
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x1640);
      this = (ParseContext *)CONCAT44(extraout_var,iVar1);
      ParseContext::ParseContext
                (this,ctx->allocator,ctx->optimizationLevel,(ArrayView<InplaceStr>)ZEXT816(0));
      pos = function->delayedDefinition;
      this->currentLexeme = pos;
      ImportModuleNamespaces(this,pos,function->importModule->bytecode);
      pSVar2 = ParseFunctionDefinition(this);
      function->definition = pSVar2;
      if (pSVar2 == (SynFunctionDefinition *)0x0) {
        anon_unknown.dwarf_c3752::Stop
                  (ctx,source,"ERROR: failed to import generic function \'%.*s\' body",
                   (ulong)(uint)(*(int *)&(function->name->name).end -
                                (int)(function->name->name).begin));
      }
    }
  }
  return pSVar2;
}

Assistant:

SynFunctionDefinition* GetGenericFunctionDefinition(ExpressionContext &ctx, SynBase *source, FunctionData *function)
{
	if(!function->definition && function->delayedDefinition)
	{
		ParseContext *parser = new (ctx.get<ParseContext>()) ParseContext(ctx.allocator, ctx.optimizationLevel, ArrayView<InplaceStr>());

		parser->currentLexeme = function->delayedDefinition;

		ImportModuleNamespaces(*parser, function->delayedDefinition, function->importModule->bytecode);

		function->definition = ParseFunctionDefinition(*parser);

		if(!function->definition)
			Stop(ctx, source, "ERROR: failed to import generic function '%.*s' body", FMT_ISTR(function->name->name));
	}

	return function->definition;
}